

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult access_tdra(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) != 0) {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
    goto LAB_0061a4d1;
  }
  if (env->aarch64 != 0) {
    uVar3 = env->pstate >> 2 & 3;
    goto LAB_0061a4d1;
  }
  uVar3 = env->uncached_cpsr & 0x1f;
  if (uVar3 == 0x10) {
    uVar3 = 0;
    goto LAB_0061a4d1;
  }
  if (uVar3 == 0x16) {
LAB_0061a4cc:
    uVar3 = 3;
  }
  else {
    if (uVar3 == 0x1a) {
      uVar3 = 2;
      goto LAB_0061a4d1;
    }
    if ((uVar1 >> 0x21 & 1) != 0) {
      if (uVar3 == 0x16) {
        uVar3 = 3;
        if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061a4d1;
      }
      else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0061a4cc;
    }
    uVar3 = 1;
  }
LAB_0061a4d1:
  if (((env->cp15).mdcr_el2 & 0x900) == 0) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    bVar4 = ((uint)uVar2 >> 0x1b & 1) == 0;
  }
  else {
    bVar4 = false;
  }
  if ((1 < uVar3) || (bVar4)) {
    if (2 < uVar3) {
      return CP_ACCESS_OK;
    }
  }
  else {
    if ((uVar1 >> 0x21 & 1) == 0) {
      return CP_ACCESS_TRAP_EL2;
    }
    if (((env->cp15).scr_el3 & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  if (((env->cp15).mdcr_el3 & 0x200) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static CPAccessResult access_tdra(CPUARMState *env, const ARMCPRegInfo *ri,
                                  bool isread)
{
    int el = arm_current_el(env);
    bool mdcr_el2_tdra = (env->cp15.mdcr_el2 & MDCR_TDRA) ||
        (env->cp15.mdcr_el2 & MDCR_TDE) ||
        (arm_hcr_el2_eff(env) & HCR_TGE);

    if (el < 2 && mdcr_el2_tdra && !arm_is_secure_below_el3(env)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.mdcr_el3 & MDCR_TDA)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}